

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse_term(Parser *this)

{
  string *token;
  VM_Writer *pVVar1;
  bool bVar2;
  int index;
  ostream *poVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_108;
  string temp_identifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string cur_token_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  token = &this->cur_token;
  Tokenizer::type(&cur_token_type,this->tokenizer,token);
  bVar2 = std::operator==(&cur_token_type,"IDENTIFIER");
  if (bVar2) {
    poVar3 = (ostream *)this->out_file;
    std::operator+(&bStack_108,"\t\t\t\t\t<identifier>",token);
    std::operator+(&temp_identifier,&bStack_108,"</identifier>");
    poVar3 = std::operator<<(poVar3,(string *)&temp_identifier);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&temp_identifier);
    std::__cxx11::string::~string((string *)&bStack_108);
    temp_identifier._M_dataplus._M_p = (pointer)&temp_identifier.field_2;
    temp_identifier._M_string_length = 0;
    temp_identifier.field_2._M_local_buf[0] = '\0';
    query_tokenizer(this);
    bVar2 = is_array(this);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>[</symbol>");
      std::endl<char,std::char_traits<char>>(poVar3);
      parse_expression(this);
      poVar3 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>]</symbol>");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    parse_subroutine_call(this);
LAB_00134f5c:
    std::__cxx11::string::~string((string *)&temp_identifier);
    goto LAB_001350ae;
  }
  bVar2 = std::operator==(&cur_token_type,"STRING_CONST");
  if (bVar2) {
LAB_00134fad:
    std::operator==(&cur_token_type,"INT_CONST");
    poVar3 = (ostream *)this->out_file;
    std::operator+(&local_68,"\t\t\t\t\t<",&cur_token_type);
    std::operator+(&local_48,&local_68,">");
    std::operator+(&local_88,&local_48,token);
    std::operator+(&local_c8,&local_88,"</");
    std::operator+(&bStack_108,&local_c8,&cur_token_type);
    std::operator+(&temp_identifier,&bStack_108,">");
    poVar3 = std::operator<<(poVar3,(string *)&temp_identifier);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&temp_identifier);
    std::__cxx11::string::~string((string *)&bStack_108);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    bVar2 = std::operator==(&cur_token_type,"INT_CONST");
    if (bVar2) goto LAB_00134fad;
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::count(&this->keyword_constant_map,token);
    if (sVar4 != 0) goto LAB_00134fad;
    bVar2 = std::operator==(token,"(");
    if (!bVar2) {
      bVar2 = std::operator==(token,"-");
      if (!bVar2) {
        bVar2 = std::operator==(token,"~");
        if (!bVar2) goto LAB_001350ae;
      }
      poVar3 = (ostream *)this->out_file;
      std::operator+(&bStack_108,"\t\t\t\t\t<symbol>",token);
      std::operator+(&temp_identifier,&bStack_108,"</symbol>");
      poVar3 = std::operator<<(poVar3,(string *)&temp_identifier);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&temp_identifier);
      std::__cxx11::string::~string((string *)&bStack_108);
      std::__cxx11::string::string((string *)&temp_identifier,(string *)token);
      query_tokenizer(this);
      Tokenizer::type(&bStack_108,this->tokenizer,token);
      bVar2 = std::operator==(&bStack_108,"INT_CONST");
      std::__cxx11::string::~string((string *)&bStack_108);
      if (bVar2) {
        pVVar1 = this->vm_writer;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bStack_108,"constant",(allocator<char> *)&local_c8);
        index = std::__cxx11::stoi(token,(size_t *)0x0,10);
        VM_Writer::write_push(pVVar1,&bStack_108,index);
        std::__cxx11::string::~string((string *)&bStack_108);
      }
      parse_term(this);
      bVar2 = std::operator==(&temp_identifier,"-");
      pVVar1 = this->vm_writer;
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bStack_108,"neg",(allocator<char> *)&local_c8);
        VM_Writer::operator<<(pVVar1,&bStack_108);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&bStack_108,"~",(allocator<char> *)&local_c8);
        VM_Writer::write_arithmetic(pVVar1,&bStack_108);
      }
      std::__cxx11::string::~string((string *)&bStack_108);
      goto LAB_00134f5c;
    }
    poVar3 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>(</symbol>");
    std::endl<char,std::char_traits<char>>(poVar3);
    query_tokenizer(this);
    parse_expression(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&temp_identifier,")",(allocator<char> *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bStack_108,"expression",(allocator<char> *)&local_88);
    check_expected_x_after_y(this,&temp_identifier,&bStack_108);
    std::__cxx11::string::~string((string *)&bStack_108);
    std::__cxx11::string::~string((string *)&temp_identifier);
    poVar3 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>)</symbol>");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  query_tokenizer(this);
LAB_001350ae:
  std::__cxx11::string::~string((string *)&cur_token_type);
  return;
}

Assistant:

void Parser::parse_term() {

    std::string cur_token_type = tokenizer.type(cur_token);
    if (cur_token_type == "IDENTIFIER") {
        out_file << "\t\t\t\t\t<identifier>" + cur_token + "</identifier>" << std::endl;
        std::string temp_identifier;

        query_tokenizer();
        if (is_array())
        {
            out_file << "\t\t\t\t\t<symbol>[</symbol>" << std::endl;
            parse_expression();
            out_file << "\t\t\t\t\t<symbol>]</symbol>" << std::endl;
        }
        parse_subroutine_call();
    }
    else if (cur_token_type == "STRING_CONST" || cur_token_type == "INT_CONST" ||
                                                                            keyword_constant_map.count(cur_token) > 0) {
        if (cur_token_type == "INT_CONST") {
        }
        out_file << "\t\t\t\t\t<" + cur_token_type +  ">" +
                    cur_token + "</" + cur_token_type + ">" << std::endl;
//        vm_writer.write_push("constant", std::stoi(cur_token));
        query_tokenizer();
    }
    else if(cur_token == "(") {
        out_file << "\t\t\t\t\t<symbol>(</symbol>" << std::endl;
        query_tokenizer();
        parse_expression();

        check_expected_x_after_y(")", "expression");
        out_file << "\t\t\t\t\t<symbol>)</symbol>" << std::endl;
        query_tokenizer();
    }
    else if (cur_token == "-" || cur_token == "~") {
        out_file << "\t\t\t\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
        std::string symbol = cur_token;

        query_tokenizer();
        // need to create an exception for int const values
        if (tokenizer.type(cur_token) == "INT_CONST") {
            vm_writer.write_push("constant", std::stoi(cur_token));
        }
        parse_term();
        if (symbol == "-") {
            vm_writer << "neg";
        }
        else {
            vm_writer.write_arithmetic("~");
        }
    }
}